

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _d;
  int _elempack;
  _func_int *p_Var1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [64];
  int iVar24;
  uint uVar25;
  undefined1 (*pauVar26) [16];
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  undefined1 (*pauVar30) [32];
  ushort uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar34 [32];
  
  p_Var1 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var1) == *(int *)(&this->field_0xd4 + (long)p_Var1)) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar13 = bottom_blob->w;
      iVar14 = bottom_blob->h;
      iVar24 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar13;
      top_blob->h = iVar14;
      top_blob->d = iVar24;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar13 = 0;
    }
  }
  else {
    iVar14 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar17 = bottom_blob->c;
    iVar13 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar18 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var1)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var1) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var1),bottom_blob,
                      top_blob,opt);
      }
      sVar18 = sVar18 * 4;
      break;
    case 2:
    case 4:
      sVar18 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar18 = bottom_blob->elemsize;
    }
    switch(iVar13) {
    case 1:
      Mat::create(top_blob,iVar14,sVar18,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar14,iVar24,sVar18,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar14,iVar24,uVar17,sVar18,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar14,iVar24,_d,uVar17,sVar18,_elempack,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
         ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2 &&
          (iVar13 = bottom_blob->c, 0 < (long)iVar13)))) {
        uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar29 = (undefined1 (*) [64])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar26 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar27 < 0x10) {
            uVar25 = 0;
          }
          else {
            iVar12 = 0xf;
            do {
              auVar36 = vmovdqu64_avx512f(*pauVar29);
              auVar32 = vcvtps2ph_avx512vl(auVar36._0_16_,0);
              *(long *)*pauVar26 = auVar32._0_8_;
              *(undefined8 *)(*pauVar26 + 8) = 0;
              *(undefined8 *)pauVar26[1] = 0;
              *(undefined8 *)(pauVar26[1] + 8) = 0;
              pauVar29 = pauVar29 + 1;
              pauVar26 = pauVar26 + 2;
              iVar12 = iVar12 + 0x10;
              uVar25 = uVar27 & 0xfffffff0;
            } while (iVar12 < (int)uVar27);
          }
          uVar16 = uVar25 | 7;
          while ((int)uVar16 < (int)uVar27) {
            auVar32 = vcvtps2ph_f16c(*(undefined1 (*) [32])*pauVar29,8);
            *pauVar26 = auVar32;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
            pauVar26 = pauVar26 + 1;
            uVar16 = uVar25 + 0xf;
            uVar25 = uVar25 + 8;
          }
          uVar16 = uVar25 | 3;
          while ((int)uVar16 < (int)uVar27) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar29,8);
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
            pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
            uVar16 = uVar25 + 7;
            uVar25 = uVar25 + 4;
          }
          if (uVar27 - uVar25 != 0 && (int)uVar25 <= (int)uVar27) {
            lVar28 = 0;
            do {
              in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
              uVar11 = float32_to_float16(*(float *)(*pauVar29 + lVar28 * 4));
              *(unsigned_short *)(*pauVar26 + lVar28 * 2) = uVar11;
              lVar28 = lVar28 + 1;
            } while (uVar27 - uVar25 != (int)lVar28);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar13);
      }
      auVar32 = in_ZMM6._0_16_;
      if (((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2) &&
          (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) &&
         (iVar13 = bottom_blob->c, 0 < (long)iVar13)) {
        uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar30 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar29 = (undefined1 (*) [64])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar27 < 0x10) {
            uVar25 = 0;
          }
          else {
            iVar12 = 0xf;
            do {
              auVar36 = vcvtph2ps_avx512f(*pauVar30);
              auVar36 = vmovdqu64_avx512f(auVar36);
              *pauVar29 = auVar36;
              pauVar30 = pauVar30 + 1;
              pauVar29 = pauVar29 + 1;
              iVar12 = iVar12 + 0x10;
              uVar25 = uVar27 & 0xfffffff0;
            } while (iVar12 < (int)uVar27);
          }
          uVar16 = uVar25 | 7;
          while ((int)uVar16 < (int)uVar27) {
            auVar34 = vcvtph2ps_f16c(*(undefined1 (*) [16])*pauVar30);
            *(undefined1 (*) [32])*pauVar29 = auVar34;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
            uVar16 = uVar25 + 0xf;
            uVar25 = uVar25 + 8;
          }
          uVar16 = uVar25 | 3;
          while ((int)uVar16 < (int)uVar27) {
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)*pauVar30;
            auVar32 = vcvtph2ps_f16c(auVar32);
            *(undefined1 (*) [16])*pauVar29 = auVar32;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + 8);
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
            uVar16 = uVar25 + 7;
            uVar25 = uVar25 + 4;
          }
          if (uVar27 - uVar25 != 0 && (int)uVar25 <= (int)uVar27) {
            lVar28 = 0;
            do {
              in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
              fVar42 = float16_to_float32(*(unsigned_short *)(*pauVar30 + lVar28 * 2));
              *(float *)(*pauVar29 + lVar28 * 4) = fVar42;
              lVar28 = lVar28 + 1;
            } while (uVar27 - uVar25 != (int)lVar28);
          }
          auVar32 = in_ZMM6._0_16_;
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar13);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 3) &&
         (0 < (int)uVar17 &&
          *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
        uVar27 = _d * _elempack * iVar24 * iVar14;
        pvVar15 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        pvVar19 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar27) {
            uVar22 = 0;
            do {
              *(float *)((long)pvVar19 + uVar22 * 4) = (float)(int)*(char *)((long)pvVar15 + uVar22)
              ;
              uVar22 = uVar22 + 1;
            } while (uVar27 != uVar22);
          }
          uVar21 = uVar21 + 1;
          pvVar19 = (void *)((long)pvVar19 + sVar3 * sVar4);
          pvVar15 = (void *)((long)pvVar15 + sVar18 * sVar5);
        } while (uVar21 != uVar17);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4)) {
        iVar13 = cpu_support_x86_avx512_bf16();
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            uVar17 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            auVar36 = vpmovsxbw_avx512bw(_DAT_005a15b9);
            auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              pauVar29 = (undefined1 (*) [64])
                         (bottom_blob->cstep * lVar20 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar23 = (undefined1 (*) [64])
                         (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar17 < 0x20) {
                uVar27 = 0;
              }
              else {
                iVar14 = 0x1f;
                do {
                  auVar40 = vmovdqu64_avx512f(*pauVar29);
                  auVar40 = vpermt2w_avx512bw(auVar40,auVar36,pauVar29[1]);
                  auVar40 = vmovdqu64_avx512f(auVar40);
                  *pauVar23 = auVar40;
                  pauVar29 = pauVar29 + 2;
                  pauVar23 = pauVar23 + 1;
                  iVar14 = iVar14 + 0x20;
                  uVar27 = uVar17 & 0xffffffe0;
                } while (iVar14 < (int)uVar17);
              }
              uVar25 = uVar27 | 0xf;
              while ((int)uVar25 < (int)uVar17) {
                auVar40 = vpsrld_avx512f(*pauVar29,0x10);
                auVar34 = vpmovdw_avx512f(auVar40);
                *(undefined1 (*) [32])*pauVar23 = auVar34;
                pauVar29 = pauVar29 + 1;
                pauVar23 = (undefined1 (*) [64])(*pauVar23 + 0x20);
                uVar25 = uVar27 + 0x1f;
                uVar27 = uVar27 + 0x10;
              }
              uVar25 = uVar27 | 7;
              while ((int)uVar25 < (int)uVar17) {
                auVar34 = vpsrld_avx512vl(*(undefined1 (*) [32])*pauVar29,0x10);
                auVar43 = vpackusdw_avx(auVar34._0_16_,auVar34._16_16_);
                *(undefined1 (*) [16])*pauVar23 = auVar43;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                pauVar23 = (undefined1 (*) [64])(*pauVar23 + 0x10);
                uVar25 = uVar27 + 0xf;
                uVar27 = uVar27 + 8;
              }
              if ((int)uVar27 < (int)uVar17) {
                auVar40 = vpbroadcastq_avx512f();
                uVar21 = 0;
                do {
                  auVar41 = vpbroadcastq_avx512f();
                  auVar37 = vporq_avx512f(auVar41,auVar38);
                  auVar41 = vporq_avx512f(auVar41,auVar39);
                  uVar7 = vpcmpuq_avx512f(auVar41,auVar40,2);
                  bVar9 = (byte)uVar7;
                  uVar7 = vpcmpuq_avx512f(auVar37,auVar40,2);
                  bVar10 = (byte)uVar7;
                  uVar31 = CONCAT11(bVar10,bVar9);
                  auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar29 + uVar21 * 4));
                  auVar37._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar41._4_4_;
                  auVar37._0_4_ = (uint)(bVar9 & 1) * auVar41._0_4_;
                  auVar37._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar41._8_4_;
                  auVar37._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar41._12_4_;
                  auVar37._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar41._16_4_;
                  auVar37._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar41._20_4_;
                  auVar37._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar41._24_4_;
                  auVar37._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar41._28_4_;
                  auVar37._32_4_ = (uint)(bVar10 & 1) * auVar41._32_4_;
                  auVar37._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar41._36_4_;
                  auVar37._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar41._40_4_;
                  auVar37._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar41._44_4_;
                  auVar37._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar41._48_4_;
                  auVar37._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar41._52_4_;
                  auVar37._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar41._56_4_;
                  auVar37._60_4_ = (uint)(bVar10 >> 7) * auVar41._60_4_;
                  auVar41 = vpsrld_avx512f(auVar37,0x10);
                  pauVar30 = (undefined1 (*) [32])(*pauVar23 + uVar21 * 2);
                  auVar34 = vpmovdw_avx512f(auVar41);
                  auVar33._0_2_ =
                       (ushort)(bVar9 & 1) * auVar34._0_2_ |
                       (ushort)!(bool)(bVar9 & 1) * *(short *)*pauVar30;
                  bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                  auVar33._2_2_ =
                       (ushort)bVar6 * auVar34._2_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 2);
                  bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                  auVar33._4_2_ =
                       (ushort)bVar6 * auVar34._4_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 4);
                  bVar6 = (bool)((byte)(uVar31 >> 3) & 1);
                  auVar33._6_2_ =
                       (ushort)bVar6 * auVar34._6_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 6);
                  bVar6 = (bool)((byte)(uVar31 >> 4) & 1);
                  auVar33._8_2_ =
                       (ushort)bVar6 * auVar34._8_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 8);
                  bVar6 = (bool)((byte)(uVar31 >> 5) & 1);
                  auVar33._10_2_ =
                       (ushort)bVar6 * auVar34._10_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 10);
                  bVar6 = (bool)((byte)(uVar31 >> 6) & 1);
                  auVar33._12_2_ =
                       (ushort)bVar6 * auVar34._12_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 0xc)
                  ;
                  bVar6 = (bool)((byte)(uVar31 >> 7) & 1);
                  auVar33._14_2_ =
                       (ushort)bVar6 * auVar34._14_2_ | (ushort)!bVar6 * *(short *)(*pauVar30 + 0xe)
                  ;
                  auVar33._16_2_ =
                       (ushort)(bVar10 & 1) * auVar34._16_2_ |
                       (ushort)!(bool)(bVar10 & 1) * *(short *)(*pauVar30 + 0x10);
                  bVar6 = (bool)(bVar10 >> 1 & 1);
                  auVar33._18_2_ =
                       (ushort)bVar6 * auVar34._18_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x12);
                  bVar6 = (bool)(bVar10 >> 2 & 1);
                  auVar33._20_2_ =
                       (ushort)bVar6 * auVar34._20_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x14);
                  bVar6 = (bool)(bVar10 >> 3 & 1);
                  auVar33._22_2_ =
                       (ushort)bVar6 * auVar34._22_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x16);
                  bVar6 = (bool)(bVar10 >> 4 & 1);
                  auVar33._24_2_ =
                       (ushort)bVar6 * auVar34._24_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x18);
                  bVar6 = (bool)(bVar10 >> 5 & 1);
                  auVar33._26_2_ =
                       (ushort)bVar6 * auVar34._26_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x1a);
                  bVar6 = (bool)(bVar10 >> 6 & 1);
                  auVar33._28_2_ =
                       (ushort)bVar6 * auVar34._28_2_ |
                       (ushort)!bVar6 * *(short *)(*pauVar30 + 0x1c);
                  auVar33._30_2_ =
                       (ushort)(bVar10 >> 7) * auVar34._30_2_ |
                       (ushort)!(bool)(bVar10 >> 7) * *(short *)(*pauVar30 + 0x1e);
                  *pauVar30 = auVar33;
                  uVar21 = uVar21 + 0x10;
                } while (((ulong)(~uVar27 + uVar17) + 0x10 & 0x1fffffff0) != uVar21);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar13);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
      iVar13 = 0;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
        auVar36 = ZEXT1664(auVar32);
        iVar14 = cpu_support_x86_avx512_bf16();
        if (iVar14 == 0) {
          iVar14 = bottom_blob->c;
          if (0 < (long)iVar14) {
            uVar17 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            iVar13 = 0;
            do {
              pauVar30 = (undefined1 (*) [32])
                         (bottom_blob->cstep * lVar20 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar29 = (undefined1 (*) [64])
                         (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar17 < 0x10) {
                uVar27 = 0;
              }
              else {
                iVar24 = 0xf;
                auVar40 = auVar36;
                do {
                  auVar33 = vpunpcklwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar30);
                  auVar34 = vpunpckhwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar30);
                  auVar36._0_16_ = ZEXT116(0) * auVar34._0_16_ + ZEXT116(1) * auVar33._0_16_;
                  auVar36._32_32_ = auVar40._32_32_;
                  auVar36._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar34._0_16_;
                  auVar34 = vperm2i128_avx2(auVar33,auVar34,0x31);
                  auVar40 = vinserti64x4_avx512f(auVar36,auVar34,1);
                  auVar40 = vmovdqu64_avx512f(auVar40);
                  *pauVar29 = auVar40;
                  pauVar30 = pauVar30 + 1;
                  pauVar29 = pauVar29 + 1;
                  iVar24 = iVar24 + 0x10;
                  auVar40 = auVar36;
                  uVar27 = uVar17 & 0xfffffff0;
                } while (iVar24 < (int)uVar17);
              }
              uVar25 = uVar27 | 7;
              while ((int)uVar25 < (int)uVar17) {
                auVar43 = vpunpcklwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar30);
                auVar32 = vpunpckhwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar30);
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar32;
                *(undefined1 (*) [16])*pauVar29 = auVar43;
                pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                uVar25 = uVar27 + 0xf;
                uVar27 = uVar27 + 8;
              }
              uVar25 = uVar27 | 3;
              while ((int)uVar25 < (int)uVar17) {
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)*pauVar30;
                auVar32 = vpunpcklwd_avx((undefined1  [16])0x0,auVar43);
                *(undefined1 (*) [16])*pauVar29 = auVar32;
                pauVar30 = (undefined1 (*) [32])(*pauVar30 + 8);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
                uVar25 = uVar27 + 7;
                uVar27 = uVar27 + 4;
              }
              if ((int)uVar27 < (int)uVar17) {
                auVar40 = vpbroadcastq_avx512f();
                uVar21 = 0;
                do {
                  auVar41 = vpbroadcastq_avx512f();
                  auVar36 = vporq_avx512f(auVar41,auVar38);
                  auVar41 = vporq_avx512f(auVar41,auVar39);
                  uVar7 = vpcmpuq_avx512f(auVar41,auVar40,2);
                  uVar8 = vpcmpuq_avx512f(auVar36,auVar40,2);
                  bVar9 = (byte)uVar8;
                  uVar31 = CONCAT11(bVar9,(byte)uVar7);
                  auVar34 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar30 + uVar21 * 2));
                  auVar35._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar34._2_2_;
                  auVar35._0_2_ = (ushort)((byte)uVar7 & 1) * auVar34._0_2_;
                  auVar35._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar34._4_2_;
                  auVar35._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar34._6_2_;
                  auVar35._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar34._8_2_;
                  auVar35._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar34._10_2_;
                  auVar35._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar34._12_2_;
                  auVar35._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar34._14_2_;
                  auVar35._16_2_ = (ushort)(bVar9 & 1) * auVar34._16_2_;
                  auVar35._18_2_ = (ushort)(bVar9 >> 1 & 1) * auVar34._18_2_;
                  auVar35._20_2_ = (ushort)(bVar9 >> 2 & 1) * auVar34._20_2_;
                  auVar35._22_2_ = (ushort)(bVar9 >> 3 & 1) * auVar34._22_2_;
                  auVar35._24_2_ = (ushort)(bVar9 >> 4 & 1) * auVar34._24_2_;
                  auVar35._26_2_ = (ushort)(bVar9 >> 5 & 1) * auVar34._26_2_;
                  auVar35._28_2_ = (ushort)(bVar9 >> 6 & 1) * auVar34._28_2_;
                  auVar35._30_2_ = (ushort)(bVar9 >> 7) * auVar34._30_2_;
                  auVar41 = vpmovzxwd_avx512f(auVar35);
                  auVar41 = vpslld_avx512f(auVar41,0x10);
                  auVar41 = vmovdqu32_avx512f(auVar41);
                  *(undefined1 (*) [64])(*pauVar29 + uVar21 * 4) = auVar41;
                  uVar21 = uVar21 + 0x10;
                } while (((ulong)(~uVar27 + uVar17) + 0x10 & 0x1fffffff0) != uVar21);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar14);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}